

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

size_t fio_ftoa(char *dest,double num,uint8_t base)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *local_48;
  char *start;
  char *pcStack_38;
  uint8_t need_zero;
  size_t written;
  int64_t *i;
  uint8_t base_local;
  double num_local;
  char *dest_local;
  
  if ((base == '\x02') || (base == '\x10')) {
    dest_local = (char *)fio_ltoa(dest,(int64_t)num,base);
  }
  else {
    iVar2 = sprintf(dest,"%g",num);
    pcStack_38 = (char *)(long)iVar2;
    bVar1 = true;
    for (local_48 = dest; *local_48 != '\0'; local_48 = local_48 + 1) {
      if (*local_48 == ',') {
        *local_48 = '.';
      }
      if ((*local_48 == '.') || (*local_48 == 'e')) {
        bVar1 = false;
        break;
      }
    }
    if (bVar1) {
      pcVar3 = pcStack_38 + 1;
      dest[(long)pcStack_38] = '.';
      pcStack_38 = pcStack_38 + 2;
      dest[(long)pcVar3] = '0';
    }
    dest_local = pcStack_38;
  }
  return (size_t)dest_local;
}

Assistant:

size_t fio_ftoa(char *dest, double num, uint8_t base) {
  if (base == 2 || base == 16) {
    /* handle the binary / Hex representation the same as if it were an
     * int64_t
     */
    int64_t *i = (void *)&num;
    return fio_ltoa(dest, *i, base);
  }

  size_t written = sprintf(dest, "%g", num);
  uint8_t need_zero = 1;
  char *start = dest;
  while (*start) {
    if (*start == ',') // locale issues?
      *start = '.';
    if (*start == '.' || *start == 'e') {
      need_zero = 0;
      break;
    }
    start++;
  }
  if (need_zero) {
    dest[written++] = '.';
    dest[written++] = '0';
  }
  return written;
}